

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_diag_sse2_128_64.c
# Opt level: O1

parasail_result_t *
parasail_sw_diag_sse2_128_64
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  int *piVar1;
  undefined1 auVar2 [16];
  undefined4 uVar3;
  undefined1 auVar4 [16];
  int iVar5;
  parasail_result_t *ppVar6;
  int64_t *ptr;
  int64_t *ptr_00;
  int64_t *ptr_01;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  long lVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  int64_t *piVar19;
  ulong uVar20;
  ulong uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  long lVar26;
  __m128i_64_t B_1;
  long lVar28;
  undefined1 auVar27 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  long lVar34;
  __m128i_64_t A_1;
  long lVar36;
  undefined1 auVar35 [16];
  ulong uVar37;
  long lVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  __m128i_64_t B_2;
  undefined1 auVar42 [16];
  __m128i_64_t A;
  undefined1 auVar43 [16];
  long lVar44;
  __m128i_64_t B;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 local_108 [16];
  ulong uStack_f0;
  undefined1 local_e8 [16];
  int64_t *local_d8;
  ulong local_d0;
  undefined8 local_c8;
  long lStack_c0;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined8 local_98;
  int iStack_90;
  undefined4 uStack_8c;
  undefined1 local_88 [16];
  long local_78;
  ulong local_70;
  long local_68;
  int *local_60;
  long local_58;
  ulong local_50;
  ulong local_48;
  undefined8 uStack_40;
  int64_t iVar11;
  
  if (_s2 == (char *)0x0) {
    parasail_sw_diag_sse2_128_64_cold_7();
  }
  else {
    uVar21 = (ulong)(uint)s2Len;
    if (s2Len < 1) {
      parasail_sw_diag_sse2_128_64_cold_6();
    }
    else if (open < 0) {
      parasail_sw_diag_sse2_128_64_cold_5();
    }
    else if (gap < 0) {
      parasail_sw_diag_sse2_128_64_cold_4();
    }
    else if (matrix == (parasail_matrix_t *)0x0) {
      parasail_sw_diag_sse2_128_64_cold_3();
    }
    else {
      if (matrix->type == 0) {
        if (_s1 == (char *)0x0) {
          parasail_sw_diag_sse2_128_64_cold_2();
          return (parasail_result_t *)0x0;
        }
        if (_s1Len < 1) {
          parasail_sw_diag_sse2_128_64_cold_1();
          return (parasail_result_t *)0x0;
        }
      }
      else {
        _s1Len = matrix->length;
      }
      iVar5 = matrix->min;
      local_c8._4_4_ = 0;
      uVar8 = 0x8000000000000000 - (long)iVar5;
      if (iVar5 != -open && SBORROW4(iVar5,-open) == iVar5 + open < 0) {
        uVar8 = (ulong)(uint)open | 0x8000000000000000;
      }
      lVar16 = uVar8 + 1;
      iVar5 = matrix->max;
      auVar22._8_4_ = (int)lVar16;
      auVar22._0_8_ = lVar16;
      auVar22._12_4_ = (int)((ulong)lVar16 >> 0x20);
      local_e8 = auVar22;
      local_c8._0_4_ = open;
      local_b8 = auVar22;
      local_98 = _s1;
      local_88 = auVar22;
      ppVar6 = parasail_result_new();
      if (ppVar6 != (parasail_result_t *)0x0) {
        ppVar6->flag = ppVar6->flag | 0x2801004;
        uVar17 = (ulong)(s2Len + 2);
        local_70 = uVar8;
        ptr = parasail_memalign_int64_t(0x10,uVar17);
        ptr_00 = parasail_memalign_int64_t(0x10,uVar17);
        ptr_01 = parasail_memalign_int64_t(0x10,uVar17);
        if (ptr_01 != (int64_t *)0x0 && (ptr_00 != (int64_t *)0x0 && ptr != (int64_t *)0x0)) {
          local_a8._0_4_ = gap;
          local_d0 = (long)_s1Len;
          if (matrix->type == 0) {
            local_d8 = parasail_memalign_int64_t(0x10,(long)(_s1Len + 1));
            if (local_d8 == (int64_t *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (0 < _s1Len) {
              piVar1 = matrix->mapper;
              uVar8 = 0;
              do {
                local_d8[uVar8] = (long)piVar1[(byte)local_98[uVar8]];
                uVar8 = uVar8 + 1;
              } while (local_d0 != uVar8);
            }
            local_d8[local_d0] = 0;
          }
          else {
            local_d8 = (int64_t *)0x0;
          }
          uVar3 = local_c8._4_4_;
          iVar7 = (int)local_c8;
          local_78 = 0x7ffffffffffffffe - (long)iVar5;
          local_108._8_4_ = (int)local_78;
          local_108._0_8_ = local_78;
          local_108._12_4_ = (int)((ulong)local_78 >> 0x20);
          uStack_f0 = auVar22._8_8_;
          local_48 = uStack_f0;
          uStack_40 = 0;
          local_98 = (char *)CONCAT44(local_c8._4_4_,(int)local_c8);
          iStack_90 = (int)local_c8;
          uStack_8c = local_c8._4_4_;
          local_a8._0_8_ = CONCAT44(0,local_a8._0_4_);
          local_a8._8_4_ = local_a8._0_4_;
          local_a8._12_4_ = 0;
          auVar4 = local_a8;
          piVar1 = matrix->mapper;
          uVar8 = 1;
          if (1 < s2Len) {
            uVar8 = uVar21;
          }
          uVar17 = 0;
          do {
            ptr[uVar17 + 1] = (long)piVar1[(byte)_s2[uVar17]];
            uVar17 = uVar17 + 1;
          } while (uVar8 != uVar17);
          uVar17 = 0;
          *ptr = 0;
          ptr[uVar21 + 1] = 0;
          do {
            ptr_00[uVar17 + 1] = 0;
            ptr_01[uVar17 + 1] = lVar16;
            uVar17 = uVar17 + 1;
          } while (uVar8 != uVar17);
          *ptr_00 = lVar16;
          *ptr_01 = lVar16;
          ptr_00[uVar21 + 1] = lVar16;
          ptr_01[uVar21 + 1] = lVar16;
          lVar18 = lVar16;
          uVar8 = uStack_f0;
          lVar12 = (long)local_98;
          if (0 < _s1Len) {
            local_60 = matrix->matrix;
            local_68 = (long)matrix->size;
            iVar5 = matrix->type;
            auVar33 = ZEXT416(1);
            uVar17 = 0;
            local_58 = lVar16;
            piVar19 = local_d8;
            do {
              uVar9 = uVar17;
              if (iVar5 == 0) {
                uVar9 = piVar19[uVar17];
              }
              local_50 = uVar17;
              if (iVar5 == 0) {
                iVar11 = piVar19[uVar17 | 1];
              }
              else {
                uVar10 = (uint)uVar17 | 1;
                if (local_d0 <= (uVar17 | 1)) {
                  uVar10 = _s1Len - 1;
                }
                iVar11 = (int64_t)(int)uVar10;
              }
              lVar12 = -(ulong)(auVar33._0_8_ < (long)local_d0);
              lVar14 = auVar33._8_8_;
              lStack_c0 = -(ulong)(lVar14 < (long)local_d0);
              local_c8._0_4_ = (int)lVar12;
              local_c8._4_4_ = (undefined4)((ulong)lVar12 >> 0x20);
              uVar20 = 0;
              auVar42 = ZEXT816(0xffffffffffffffff);
              auVar27._8_8_ = 0;
              auVar27._0_8_ = uStack_f0;
              auVar35 = auVar22;
              auVar29 = auVar27;
              auVar46 = auVar22;
              do {
                auVar43._0_8_ = auVar27._8_8_;
                auVar43._8_8_ = ptr_00[uVar20 + 1];
                lVar38 = ptr_00[uVar20 + 1] - CONCAT44(uVar3,iVar7);
                local_a8._12_4_ = 0;
                lVar34 = auVar35._8_8_ - local_a8._0_8_;
                if (lVar34 < auVar43._0_8_ - (long)local_98) {
                  lVar34 = auVar43._0_8_ - (long)local_98;
                }
                lVar13 = ptr_01[uVar20 + 1] - local_a8._8_8_;
                if (ptr_01[uVar20 + 1] - local_a8._8_8_ < lVar38) {
                  lVar13 = lVar38;
                }
                lVar26 = auVar27._0_8_ - (long)local_98;
                lVar28 = auVar43._0_8_ - CONCAT44(uVar3,iVar7);
                lVar44 = auVar46._0_8_ - local_a8._0_8_;
                lVar38 = auVar46._8_8_ - local_a8._8_8_;
                if (lVar44 < lVar26) {
                  lVar44 = lVar26;
                }
                if (lVar38 < lVar28) {
                  lVar38 = lVar28;
                }
                lVar28 = (long)local_60[iVar11 * local_68 + ptr[uVar20]] + auVar29._0_8_;
                lVar36 = (long)local_60[uVar9 * local_68 + ptr[uVar20 + 1]] + auVar29._8_8_;
                lVar26 = lVar44;
                if (lVar44 < lVar28) {
                  lVar26 = lVar28;
                }
                lVar28 = lVar38;
                if (lVar38 < lVar36) {
                  lVar28 = lVar36;
                }
                if (lVar26 <= lVar34) {
                  lVar26 = lVar34;
                }
                if (lVar28 <= lVar13) {
                  lVar28 = lVar13;
                }
                auVar35._8_8_ = lVar13;
                auVar35._0_8_ = lVar34;
                if (lVar26 < 1) {
                  lVar26 = 0;
                }
                auVar29._8_8_ = lVar38;
                auVar29._0_8_ = lVar44;
                if (lVar28 < 1) {
                  lVar28 = 0;
                }
                auVar46._8_8_ = lVar28;
                auVar46._0_8_ = lVar26;
                lVar38 = auVar42._0_8_;
                lVar13 = auVar42._8_8_;
                auVar45._8_8_ = -(ulong)(lVar13 == -1);
                auVar45._0_8_ = -(ulong)(lVar38 == -1);
                auVar27 = ~auVar45 & auVar46;
                auVar35 = ~auVar45 & auVar35 | auVar45 & auVar22;
                lVar34 = auVar27._0_8_;
                uVar37 = auVar27._8_8_;
                if (1 < uVar20) {
                  if (lVar34 <= (long)local_108._0_8_) {
                    local_108._0_8_ = lVar34;
                  }
                  if ((long)uVar37 <= (long)local_108._8_8_) {
                    local_108._8_8_ = uVar37;
                  }
                  if (lVar18 <= lVar34) {
                    lVar18 = lVar34;
                  }
                  uVar15 = uVar37;
                  if ((long)uVar37 < (long)uVar8) {
                    uVar15 = uVar8;
                  }
                  uVar8 = uVar15;
                }
                auVar46 = ~auVar45 & auVar29 | auVar45 & auVar22;
                ptr_00[uVar20] = lVar34;
                ptr_01[uVar20] = auVar35._0_8_;
                auVar30._4_4_ = auVar42._4_4_;
                auVar30._0_4_ = auVar42._4_4_;
                auVar30._8_4_ = auVar42._12_4_;
                auVar30._12_4_ = auVar42._12_4_;
                auVar23._8_4_ = 0xffffffff;
                auVar23._0_8_ = 0xffffffffffffffff;
                auVar23._12_4_ = 0xffffffff;
                auVar30 = auVar30 ^ auVar23;
                auVar31._0_4_ = auVar30._0_4_ >> 0x1f;
                auVar31._4_4_ = auVar30._4_4_ >> 0x1f;
                auVar31._8_4_ = auVar30._8_4_ >> 0x1f;
                auVar31._12_4_ = auVar30._12_4_ >> 0x1f;
                auVar2._8_8_ = lStack_c0;
                auVar2._0_8_ = lVar12;
                auVar41._8_8_ = -(ulong)(lVar13 < (long)uVar21);
                auVar41._0_8_ = -(ulong)(lVar38 < (long)uVar21);
                auVar41 = auVar41 & auVar31 & auVar2;
                lVar44 = local_88._0_8_;
                uVar15 = local_88._8_8_;
                auVar40._8_8_ = -(ulong)(uVar37 == uVar15);
                auVar40._0_8_ = -(ulong)(lVar34 == lVar44);
                auVar32._8_8_ = -(ulong)(uVar37 != uVar15 && (long)uVar15 <= (long)uVar37);
                auVar32._0_8_ = -(ulong)(lVar34 != lVar44 && lVar44 <= lVar34);
                auVar32 = auVar32 & auVar41;
                auVar39._8_8_ = -(ulong)(lVar13 < local_b8._8_8_);
                auVar39._0_8_ = -(ulong)(lVar38 < local_b8._0_8_);
                local_88 = auVar32 & auVar27 | ~auVar32 & local_88;
                auVar40 = auVar39 & auVar41 & auVar40;
                local_e8 = auVar40 & auVar33 | ~auVar40 & (auVar32 & auVar33 | ~auVar32 & local_e8);
                local_b8 = auVar40 & auVar42 | ~auVar40 & (auVar32 & auVar42 | ~auVar32 & local_b8);
                auVar42._0_8_ = lVar38 + 1;
                auVar42._8_8_ = lVar13 - auVar23._8_8_;
                uVar20 = uVar20 + 1;
                auVar29 = auVar43;
              } while (s2Len + 1 != uVar20);
              auVar33._0_8_ = auVar33._0_8_ + 2;
              auVar33._8_8_ = lVar14 + 2;
              uVar17 = uVar17 + 2;
              piVar19 = local_d8;
            } while (uVar17 < local_d0);
          }
          lVar14 = 0;
          iVar5 = 0;
          iVar7 = 0;
          do {
            lVar34 = *(long *)(local_88 + lVar14 * 8);
            if (lVar16 < lVar34) {
              iVar5 = *(int *)(local_e8 + lVar14 * 8);
              lVar16 = lVar34;
              iVar7 = *(int *)(local_b8 + lVar14 * 8);
            }
            else if (lVar34 == lVar16) {
              lVar34 = *(long *)(local_b8 + lVar14 * 8);
              if (lVar34 < iVar7) {
                iVar5 = *(int *)(local_e8 + lVar14 * 8);
                iVar7 = (int)lVar34;
              }
              else if ((lVar34 == iVar7) && (*(long *)(local_e8 + lVar14 * 8) < (long)iVar5)) {
                iVar5 = (int)*(long *)(local_e8 + lVar14 * 8);
                iVar7 = (int)lVar34;
              }
            }
            lVar14 = lVar14 + 1;
          } while ((int)lVar14 == 1);
          auVar24._8_8_ = -(ulong)((long)local_108._8_8_ <= (long)local_70);
          auVar24._0_8_ = -(ulong)((long)local_108._0_8_ <= (long)local_70);
          auVar25._8_8_ = -(ulong)(local_78 < (long)uVar8);
          auVar25._0_8_ = -(ulong)(local_78 < lVar18);
          auVar25 = auVar25 | auVar24;
          if ((((((((((((((((auVar25 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar25 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar25 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar25 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar25 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar25 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar25 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar25 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar25 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar25 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar25 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar25 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar25 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar25 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar25 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar25[0xf] < '\0') {
            *(byte *)&ppVar6->flag = (byte)ppVar6->flag | 0x40;
            lVar16 = 0;
            iVar7 = 0;
            iVar5 = 0;
          }
          ppVar6->score = (int)lVar16;
          ppVar6->end_query = iVar5;
          ppVar6->end_ref = iVar7;
          local_a8 = auVar4;
          local_c8 = lVar12;
          parasail_free(ptr_01);
          parasail_free(ptr_00);
          parasail_free(ptr);
          if (matrix->type == 0) {
            parasail_free(local_d8);
            return ppVar6;
          }
          return ppVar6;
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int64_t * restrict s1 = NULL;
    int64_t * restrict s2B = NULL;
    int64_t * restrict _H_pr = NULL;
    int64_t * restrict _F_pr = NULL;
    int64_t * restrict s2 = NULL;
    int64_t * restrict H_pr = NULL;
    int64_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    int64_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vNegInf;
    __m128i vNegInf0;
    __m128i vOpen;
    __m128i vGap;
    __m128i vZero;
    __m128i vOne;
    __m128i vN;
    __m128i vNegOne;
    __m128i vI;
    __m128i vJreset;
    __m128i vMaxH;
    __m128i vEndI;
    __m128i vEndJ;
    __m128i vILimit;
    __m128i vJLimit;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 2; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vNegInf0 = _mm_srli_si128(vNegInf, 8); /* shift in a 0 */
    vOpen = _mm_set1_epi64x_rpl(open);
    vGap  = _mm_set1_epi64x_rpl(gap);
    vZero = _mm_set1_epi64x_rpl(0);
    vOne = _mm_set1_epi64x_rpl(1);
    vN = _mm_set1_epi64x_rpl(N);
    vNegOne = _mm_set1_epi64x_rpl(-1);
    vI = _mm_set_epi64x_rpl(0,1);
    vJreset = _mm_set_epi64x_rpl(0,-1);
    vMaxH = vNegInf;
    vEndI = vNegInf;
    vEndJ = vNegInf;
    vILimit = _mm_set1_epi64x_rpl(s1Len);
    vJLimit = _mm_set1_epi64x_rpl(s2Len);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_2;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int64_t(16, s2Len+PAD2);
    _H_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    _F_pr = parasail_memalign_int64_t(16, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int64_t(16, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = 0;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m128i vNH = vNegInf0;
        __m128i vWH = vNegInf0;
        __m128i vE = vNegInf;
        __m128i vF = vNegInf;
        __m128i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        __m128i vIltLimit = _mm_cmplt_epi64_rpl(vI, vILimit);
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m128i vMat;
            __m128i vNWH = vNH;
            vNH = _mm_srli_si128(vWH, 8);
            vNH = _mm_insert_epi64_rpl(vNH, H_pr[j], 1);
            vF = _mm_srli_si128(vF, 8);
            vF = _mm_insert_epi64_rpl(vF, F_pr[j], 1);
            vF = _mm_max_epi64_rpl(
                    _mm_sub_epi64(vNH, vOpen),
                    _mm_sub_epi64(vF, vGap));
            vE = _mm_max_epi64_rpl(
                    _mm_sub_epi64(vWH, vOpen),
                    _mm_sub_epi64(vE, vGap));
            vMat = _mm_set_epi64x_rpl(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]]
                    );
            vNWH = _mm_add_epi64(vNWH, vMat);
            vWH = _mm_max_epi64_rpl(vNWH, vE);
            vWH = _mm_max_epi64_rpl(vWH, vF);
            vWH = _mm_max_epi64_rpl(vWH, vZero);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m128i cond = _mm_cmpeq_epi64_rpl(vJ,vNegOne);
                vWH = _mm_andnot_si128(cond, vWH);
                vF = _mm_blendv_epi8_rpl(vF, vNegInf, cond);
                vE = _mm_blendv_epi8_rpl(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vWH,0);
            F_pr[j-1] = (int64_t)_mm_extract_epi64_rpl(vF,0);
            /* as minor diagonal vector passes across table, extract
             * max values within the i,j bounds */
            {
                __m128i cond_valid_J = _mm_and_si128(
                        _mm_cmpgt_epi64_rpl(vJ, vNegOne),
                        _mm_cmplt_epi64_rpl(vJ, vJLimit));
                __m128i cond_valid_IJ = _mm_and_si128(cond_valid_J, vIltLimit);
                __m128i cond_eq = _mm_cmpeq_epi64_rpl(vWH, vMaxH);
                __m128i cond_max = _mm_cmpgt_epi64_rpl(vWH, vMaxH);
                __m128i cond_all = _mm_and_si128(cond_max, cond_valid_IJ);
                __m128i cond_Jlt = _mm_cmplt_epi64_rpl(vJ, vEndJ);
                vMaxH = _mm_blendv_epi8_rpl(vMaxH, vWH, cond_all);
                vEndI = _mm_blendv_epi8_rpl(vEndI, vI, cond_all);
                vEndJ = _mm_blendv_epi8_rpl(vEndJ, vJ, cond_all);
                cond_all = _mm_and_si128(cond_Jlt, cond_eq);
                cond_all = _mm_and_si128(cond_all, cond_valid_IJ);
                vEndI = _mm_blendv_epi8_rpl(vEndI, vI, cond_all);
                vEndJ = _mm_blendv_epi8_rpl(vEndJ, vJ, cond_all);
            }
            vJ = _mm_add_epi64(vJ, vOne);
        }
        vI = _mm_add_epi64(vI, vN);
    }

    /* alignment ending position */
    {
        int64_t *t = (int64_t*)&vMaxH;
        int64_t *i = (int64_t*)&vEndI;
        int64_t *j = (int64_t*)&vEndJ;
        int32_t k;
        for (k=0; k<N; ++k, ++t, ++i, ++j) {
            if (*t > score) {
                score = *t;
                end_query = *i;
                end_ref = *j;
            }
            else if (*t == score) {
                if (*j < end_ref) {
                    end_query = *i;
                    end_ref = *j;
                }
                else if (*j == end_ref && *i < end_query) {
                    end_query = *i;
                    end_ref = *j;
                }
            }
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi64_rpl(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}